

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AlternativePass1
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_00;
  undefined4 *puVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  ConcatNode *pCVar7;
  Node *pNVar8;
  TrackAllocData local_260;
  code *local_238;
  undefined8 local_230;
  TrackAllocData local_228;
  ConcatNode *local_200;
  ConcatNode *cons_2;
  undefined8 local_1f0;
  TrackAllocData local_1e8;
  ConcatNode *local_1c0;
  ConcatNode *nextList;
  undefined8 local_1b0;
  TrackAllocData local_1a8;
  ConcatNode *local_180;
  ConcatNode *cons_1;
  undefined8 local_170;
  TrackAllocData local_168;
  code *local_140;
  undefined8 local_138;
  TrackAllocData local_130;
  ConcatNode *local_108;
  ConcatNode *cons;
  Node *next;
  ConcatNode *last;
  Node *node;
  undefined1 local_e0 [7];
  bool previousSurrogatePart;
  MatchLiteralNode deferredLiteralNode;
  MatchCharNode deferredCharNode;
  TrackAllocData local_40;
  Parser<UTF8EncodingPolicyBase<false>,_true> *local_18;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_local;
  
  local_18 = this;
  bVar3 = IsEndOfAlternative(this);
  if (bVar3) {
    pAVar6 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&SimpleNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0x37e);
    pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar6,&local_40);
    this_00 = (Parser<UTF8EncodingPolicyBase<false>,_true> *)
              new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar6,0x3f67b0);
    SimpleNode::SimpleNode((SimpleNode *)this_00,Empty);
    this_local = this_00;
  }
  else {
    MatchCharNode::MatchCharNode((MatchCharNode *)&deferredLiteralNode.isEquivClass,L'\0');
    MatchLiteralNode::MatchLiteralNode((MatchLiteralNode *)local_e0,0,0);
    node._7_1_ = 0;
    last = (ConcatNode *)
           TermPass1(this,(MatchCharNode *)&deferredLiteralNode.isEquivClass,
                     (bool *)((long)&node + 7));
    if (last == (ConcatNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x389,"(node != nullptr)","node != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    next = (Node *)0x0;
    if ((last->super_Node).tag == Concat) {
      next = &last->super_Node;
      while (lVar1._0_2_ = next[1].tag, lVar1._2_2_ = next[1].features,
            lVar1._4_4_ = *(undefined4 *)&next[1].field_0xc, lVar1 != 0) {
        next = *(Node **)&next[1].tag;
      }
    }
    if (next == (Node *)0x0) {
      iVar4 = (**(last->super_Node)._vptr_Node)();
      if (iVar4 != 0) {
        AccumLiteral(this,(MatchLiteralNode *)local_e0,&last->super_Node);
        last = (ConcatNode *)local_e0;
      }
    }
    else {
      iVar4 = (**(code **)*next[1]._vptr_Node)();
      if (iVar4 != 0) {
        AccumLiteral(this,(MatchLiteralNode *)local_e0,(Node *)next[1]._vptr_Node);
        next[1]._vptr_Node = (_func_int **)local_e0;
      }
    }
    while (bVar3 = IsEndOfAlternative(this), ((bVar3 ^ 0xffU) & 1) != 0) {
      cons = (ConcatNode *)
             TermPass1(this,(MatchCharNode *)&deferredLiteralNode.isEquivClass,
                       (bool *)((long)&node + 7));
      if (cons == (ConcatNode *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x3a9,"(next != nullptr)","next != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      iVar4 = (**(cons->super_Node)._vptr_Node)();
      if (iVar4 == 0) {
        if ((cons->super_Node).tag == Concat) {
          local_1c0 = cons;
          iVar4 = (**cons->head->_vptr_Node)();
          if ((iVar4 != 0) &&
             (((next == (Node *)0x0 && (last == (ConcatNode *)local_e0)) ||
              ((next != (Node *)0x0 && (next[1]._vptr_Node == (_func_int **)local_e0)))))) {
            AccumLiteral(this,(MatchLiteralNode *)local_e0,local_1c0->head);
            local_1c0 = local_1c0->tail;
            if (local_1c0 == (ConcatNode *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x3d2,"(nextList != 0)","nextList != 0");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            iVar4 = (**local_1c0->head->_vptr_Node)();
            if (iVar4 != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x3d4,"(nextList->head->LiteralLength() == 0)",
                                 "nextList->head->LiteralLength() == 0");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
          }
          if (next == (Node *)0x0) {
            pAVar6 = &this->ctAllocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_1e8,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x3d7);
            pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     TrackAllocInfo(pAVar6,&local_1e8);
            cons_2 = (ConcatNode *)Memory::ArenaAllocator::Alloc;
            local_1f0 = 0;
            pCVar7 = (ConcatNode *)
                     new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
            pNVar8 = FinalTerm(this,&last->super_Node,(MatchLiteralNode *)local_e0);
            ConcatNode::ConcatNode(pCVar7,pNVar8,local_1c0);
            last = pCVar7;
          }
          else {
            pNVar8 = FinalTerm(this,(Node *)next[1]._vptr_Node,(MatchLiteralNode *)local_e0);
            next[1]._vptr_Node = (_func_int **)pNVar8;
            *(ConcatNode **)&next[1].tag = local_1c0;
          }
          if (local_1c0 == (ConcatNode *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x3e0,"(nextList != nullptr)","nextList != nullptr");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          for (; local_1c0->tail != (ConcatNode *)0x0; local_1c0 = local_1c0->tail) {
          }
          next = &local_1c0->super_Node;
          if (deferredLiteralNode.super_Node.followConsumes.upper != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x3e5,"(deferredLiteralNode.length == 0)",
                               "deferredLiteralNode.length == 0");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          if (next == (Node *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,999,"(last != nullptr)","last != nullptr");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          iVar4 = (**(code **)*next[1]._vptr_Node)();
          if (iVar4 != 0) {
            AccumLiteral(this,(MatchLiteralNode *)local_e0,(Node *)next[1]._vptr_Node);
            next[1]._vptr_Node = (_func_int **)local_e0;
          }
        }
        else {
          pAVar6 = &this->ctAllocator->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_228,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                     ,0x3f4);
          pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo(pAVar6,&local_228);
          local_238 = Memory::ArenaAllocator::Alloc;
          local_230 = 0;
          pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0)
          ;
          ConcatNode::ConcatNode(pCVar7,&cons->super_Node,(ConcatNode *)0x0);
          local_200 = pCVar7;
          if (next == (Node *)0x0) {
            pAVar6 = &this->ctAllocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_260,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x3f6);
            pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     TrackAllocInfo(pAVar6,&local_260);
            pCVar7 = (ConcatNode *)
                     new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
            pNVar8 = FinalTerm(this,&last->super_Node,(MatchLiteralNode *)local_e0);
            ConcatNode::ConcatNode(pCVar7,pNVar8,local_200);
            last = pCVar7;
          }
          else {
            pNVar8 = FinalTerm(this,(Node *)next[1]._vptr_Node,(MatchLiteralNode *)local_e0);
            next[1]._vptr_Node = (_func_int **)pNVar8;
            *(ConcatNode **)&next[1].tag = local_200;
          }
          next = &local_200->super_Node;
          if (deferredLiteralNode.super_Node.followConsumes.upper != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x3fe,"(deferredLiteralNode.length == 0)",
                               "deferredLiteralNode.length == 0");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
        }
      }
      else {
        AccumLiteral(this,(MatchLiteralNode *)local_e0,&cons->super_Node);
        if (next == (Node *)0x0) {
          if (last != (ConcatNode *)local_e0) {
            pAVar6 = &this->ctAllocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_130,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x3b3);
            pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     TrackAllocInfo(pAVar6,&local_130);
            local_140 = Memory::ArenaAllocator::Alloc;
            local_138 = 0;
            pCVar7 = (ConcatNode *)
                     new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
            ConcatNode::ConcatNode(pCVar7,(Node *)local_e0,(ConcatNode *)0x0);
            pAVar6 = &this->ctAllocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
            local_108 = pCVar7;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_168,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x3b4);
            pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     TrackAllocInfo(pAVar6,&local_168);
            cons_1 = (ConcatNode *)Memory::ArenaAllocator::Alloc;
            local_170 = 0;
            pCVar7 = (ConcatNode *)
                     new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
            ConcatNode::ConcatNode(pCVar7,&last->super_Node,local_108);
            next = &local_108->super_Node;
            last = pCVar7;
          }
        }
        else if (next[1]._vptr_Node != (_func_int **)local_e0) {
          pAVar6 = &this->ctAllocator->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_1a8,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                     ,0x3be);
          pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo(pAVar6,&local_1a8);
          nextList = (ConcatNode *)Memory::ArenaAllocator::Alloc;
          local_1b0 = 0;
          pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0)
          ;
          ConcatNode::ConcatNode(pCVar7,(Node *)local_e0,(ConcatNode *)0x0);
          *(ConcatNode **)&next[1].tag = pCVar7;
          local_180 = pCVar7;
          next = (Node *)pCVar7;
        }
      }
    }
    if (next == (Node *)0x0) {
      last = (ConcatNode *)FinalTerm(this,&last->super_Node,(MatchLiteralNode *)local_e0);
    }
    else {
      pNVar8 = FinalTerm(this,(Node *)next[1]._vptr_Node,(MatchLiteralNode *)local_e0);
      next[1]._vptr_Node = (_func_int **)pNVar8;
    }
    if (deferredLiteralNode.super_Node.followConsumes.upper != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x406,"(deferredLiteralNode.length == 0)",
                         "deferredLiteralNode.length == 0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_local = (Parser<UTF8EncodingPolicyBase<false>,_true> *)last;
  }
  return (Node *)this_local;
}

Assistant:

Node* Parser<P, IsLiteral>::AlternativePass1()
    {
        if (IsEndOfAlternative())
            return Anew(ctAllocator, SimpleNode, Node::Empty);

        MatchCharNode deferredCharNode(0);
        MatchLiteralNode deferredLiteralNode(0, 0);

        // Maintain the invariants:
        //  - concat lists have two or more items
        //  - concat list items are never concat lists
        //  - a concat list never contains two consecutive match-character/match-literal nodes
        bool previousSurrogatePart = false;
        Node* node = TermPass1(&deferredCharNode, previousSurrogatePart);
        AnalysisAssert(node != nullptr);
        ConcatNode* last = 0;
        // First node may be a concat
        if (node->tag == Node::Concat)
        {
            last = (ConcatNode*)node;
            while (last->tail != 0)
                last = last->tail;
        }

        if (last == 0)
        {
            if (node->LiteralLength() > 0)
            {
                // Begin a new literal
                AccumLiteral(&deferredLiteralNode, node);
                node = &deferredLiteralNode;
            }
        }
        else
        {
            if (last->head->LiteralLength() > 0)
            {
                // Begin a new literal
                AccumLiteral(&deferredLiteralNode, last->head);
                last->head = &deferredLiteralNode;
            }
        }

        while (!IsEndOfAlternative())
        {
            Node* next = TermPass1(&deferredCharNode, previousSurrogatePart);
            AnalysisAssert(next != nullptr);
            if (next->LiteralLength() > 0)
            {
                // Begin a new literal or grow the existing literal
                AccumLiteral(&deferredLiteralNode, next);
                if (last == 0)
                {
                    if (node != &deferredLiteralNode)
                    {
                        // So far we have first item and the current literal
                        ConcatNode* cons = Anew(ctAllocator, ConcatNode, &deferredLiteralNode, 0);
                        node = Anew(ctAllocator, ConcatNode, node, cons);
                        last = cons;
                    }
                    // else: keep growing first literal
                }
                else
                {
                    if (last->head != &deferredLiteralNode)
                    {
                        // Append a new literal node
                        ConcatNode* cons = Anew(ctAllocator, ConcatNode, &deferredLiteralNode, 0);
                        last->tail = cons;
                        last = cons;
                    }
                    // else: keep growing current literal
                }
            }
            else if (next->tag == Node::Concat)
            {
                // Append this list to accumulated list
                ConcatNode* nextList = (ConcatNode*)next;
                if (nextList->head->LiteralLength() > 0 &&
                    ((last == 0 && node == &deferredLiteralNode) ||
                     (last != 0 && last->head == &deferredLiteralNode)))
                {
                    // Absorb the next character or literal into the current literal
                    // (may leave a gab in litbuf)
                    AccumLiteral(&deferredLiteralNode, nextList->head);
                    nextList = nextList->tail;
                    // List has at least two items
                    AnalysisAssert(nextList != 0);
                    // List should be in canonical form, so no consecutive chars/literals
                    Assert(nextList->head->LiteralLength() == 0);
                }
                if (last == 0)
                    node = Anew(ctAllocator, ConcatNode, FinalTerm(node, &deferredLiteralNode), nextList);
                else
                {
                    last->head = FinalTerm(last->head, &deferredLiteralNode);
                    last->tail = nextList;
                }
                // NextList can't be nullptr, since it was last set as next, which
                // was dereferenced, or it was set on a path that already has this
                // analysis assert.
                AnalysisAssert(nextList != nullptr);
                while (nextList->tail != 0)
                    nextList = nextList->tail;
                last = nextList;
                // No outstanding literals
                Assert(deferredLiteralNode.length == 0);
                // We just set this from nextList, which we know is not nullptr.
                AnalysisAssert(last != nullptr);
                if (last->head->LiteralLength() > 0)
                {
                    // If the list ends with a literal, transfer it into deferredLiteralNode
                    // so we can continue accumulating (won't leave a gab in litbuf)
                    AccumLiteral(&deferredLiteralNode, last->head);
                    // Can discard MatchLiteralNode since it lives in compile-time allocator
                    last->head = &deferredLiteralNode;
                }
            }
            else
            {
                // Append this node to accumulated list
                ConcatNode* cons = Anew(ctAllocator, ConcatNode, next, 0);
                if (last == 0)
                    node = Anew(ctAllocator, ConcatNode, FinalTerm(node, &deferredLiteralNode), cons);
                else
                {
                    last->head = FinalTerm(last->head, &deferredLiteralNode);
                    last->tail = cons;
                }
                last = cons;
                // No outstanding literals
                Assert(deferredLiteralNode.length == 0);
            }
        }
        if (last == 0)
            node = FinalTerm(node, &deferredLiteralNode);
        else
            last->head = FinalTerm(last->head, &deferredLiteralNode);
        // No outstanding literals
        Assert(deferredLiteralNode.length == 0);

        return node;
    }